

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O1

void __thiscall
cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<std::exception>>::
set_result<std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<std::exception>&>
          (async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<std::exception>>
           *this,shared_ptr<cornerstone::resp_msg> *result,shared_ptr<std::exception> *err)

{
  int iVar1;
  handler_type handler;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x48));
  if (iVar1 == 0) {
    *(element_type **)this =
         (result->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
               &(result->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    *(element_type **)(this + 0x10) =
         (err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x18),
               &(err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    this[0x20] = (async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<std::exception>>
                  )0x1;
    if (*(long *)(this + 0x38) != 0) {
      std::
      function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
      ::operator=((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
                   *)&local_48,
                  (function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
                   *)(this + 0x28));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x48));
    if (local_38 != (code *)0x0) {
      (*pcStack_30)(&local_48,(shared_ptr<cornerstone::resp_msg> *)this,
                    (shared_ptr<std::exception> *)(this + 0x10));
    }
    std::condition_variable::notify_all();
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void set_result(_TResult&& result, _TException&& err)
    {
        handler_type handler;
        {
            std::lock_guard<std::mutex> guard(lock_);
            result_ = std::forward<_TResult>(result);
            err_ = std::forward<_TException>(err);
            has_result_ = true;
            if (handler_)
            {
                handler = handler_; // copy handler as std::function assignment is not atomic guaranteed
            }
        }

        if (handler)
        {
            handler(result_, err_);
        }

        cv_.notify_all();
    }